

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall Js::ByteCodeWriter::Reg2(ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  RegSlot R0_00;
  RegSlot R1_00;
  undefined4 *puVar5;
  FunctionBody *pFVar6;
  RegSlot local_3c;
  RegSlot local_38;
  Type local_34;
  OpCode local_32 [3];
  ProfileId profileId;
  OpCode op_local;
  
  local_32[0] = op;
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x2);
  bVar3 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x181,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar3) goto LAB_0088c696;
    *puVar5 = 0;
  }
  if (R0 != 0xffffffff) {
    pFVar6 = this->m_functionWrite;
    if (pFVar6 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar3) goto LAB_0088c696;
      *puVar5 = 0;
      pFVar6 = this->m_functionWrite;
    }
    R0_00 = FunctionBody::MapRegSlot(pFVar6,R0);
    if (R1 != 0xffffffff) {
      pFVar6 = this->m_functionWrite;
      if (pFVar6 == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (!bVar3) goto LAB_0088c696;
        *puVar5 = 0;
        pFVar6 = this->m_functionWrite;
      }
      R1_00 = FunctionBody::MapRegSlot(pFVar6,R1);
      local_34 = 0xffff;
      if (op == BeginSwitch) {
        bVar3 = DynamicProfileInfo::IsEnabled(SwitchOptPhase,this->m_functionWrite);
        op = BeginSwitch;
        if (!bVar3) goto LAB_0088c4f1;
        TVar1 = this->m_functionWrite->profiledSwitchCount;
        if (TVar1 == 0xffff) goto LAB_0088c4f1;
        this->m_functionWrite->profiledSwitchCount = TVar1 + 1;
        local_34 = TVar1;
        OpCodeUtil::ConvertNonCallOpToProfiled(local_32);
        bVar3 = true;
        op = local_32[0];
      }
      else {
LAB_0088c4f1:
        bVar3 = false;
      }
      bVar4 = DoProfileNewScObjArrayOp(this,op);
      if (bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x192,"(DoProfileNewScObjArrayOp(op) == false)",
                                    "DoProfileNewScObjArrayOp(op) == false");
        if (!bVar4) goto LAB_0088c696;
        *puVar5 = 0;
      }
      bVar4 = DoProfileNewScObjectOp(this,local_32[0]);
      if (!bVar4) {
LAB_0088c5be:
        bVar4 = TryWriteReg2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,local_32[0],R0_00,R1_00);
        if (!bVar4) {
          bVar4 = TryWriteReg2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                            (this,local_32[0],R0_00,R1_00);
          if (!bVar4) {
            local_3c = R0_00;
            local_38 = R1_00;
            Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,local_32[0],this);
            Data::Write(&this->m_byteCodeData,&local_3c,8);
          }
        }
        if (bVar3) {
          Data::Write(&this->m_byteCodeData,&local_34,2);
        }
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x194,"(DoProfileNewScObjectOp(op) == false)",
                                  "DoProfileNewScObjectOp(op) == false");
      if (bVar4) {
        *puVar5 = 0;
        goto LAB_0088c5be;
      }
      goto LAB_0088c696;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar5 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar3) {
    *puVar5 = 0;
    Throw::InternalError();
  }
LAB_0088c696:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void ByteCodeWriter::Reg2(OpCode op, RegSlot R0, RegSlot R1)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg2);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);

        bool isProfiled = false;
        bool isProfiled2 = false;
        Js::ProfileId profileId = Js::Constants::NoProfileId;
        Js::ProfileId profileId2 = Js::Constants::NoProfileId;

        if (op == Js::OpCode::BeginSwitch && DoDynamicProfileOpcode(SwitchOptPhase) &&
            this->m_functionWrite->AllocProfiledSwitch(&profileId))
        {
            OpCodeUtil::ConvertNonCallOpToProfiled(op);
            isProfiled = true;
        }

        Assert(DoProfileNewScObjArrayOp(op) == false);

        Assert(DoProfileNewScObjectOp(op) == false);

        MULTISIZE_LAYOUT_WRITE(Reg2, op, R0, R1);

        if (isProfiled)
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
            if (isProfiled2)
            {
                m_byteCodeData.Encode(&profileId2, sizeof(Js::ProfileId));
            }
        }
    }